

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::polygon_mode_is_supported(Impl *this,VkPolygonMode mode)

{
  size_type sVar1;
  allocator local_41;
  string local_40 [36];
  VkPolygonMode local_1c;
  Impl *pIStack_18;
  VkPolygonMode mode_local;
  Impl *this_local;
  
  if (mode == VK_POLYGON_MODE_FILL) {
    this_local._7_1_ = 1;
  }
  else if (mode - VK_POLYGON_MODE_LINE < 2) {
    this_local._7_1_ = (this->features2).features.fillModeNonSolid == 1;
  }
  else if (mode == VK_POLYGON_MODE_FILL_RECTANGLE_NV) {
    local_1c = mode;
    pIStack_18 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"VK_NV_fill_rectangle",&local_41);
    sVar1 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this->enabled_extensions,(key_type *)local_40);
    this_local._7_1_ = sVar1 != 0;
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool FeatureFilter::Impl::polygon_mode_is_supported(VkPolygonMode mode) const
{
	switch (mode)
	{
	case VK_POLYGON_MODE_FILL:
		return true;

	case VK_POLYGON_MODE_POINT:
	case VK_POLYGON_MODE_LINE:
		return features2.features.fillModeNonSolid == VK_TRUE;

	case VK_POLYGON_MODE_FILL_RECTANGLE_NV:
		return enabled_extensions.count(VK_NV_FILL_RECTANGLE_EXTENSION_NAME) != 0;

	default:
		return false;
	}
}